

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAPI.cpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderIncompatibleDrawCallModeTest::deinit
          (GeometryShaderIncompatibleDrawCallModeTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  GLuint *pGVar3;
  ulong uVar4;
  long lVar2;
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_fs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_fs_id = 0;
  }
  pGVar3 = this->m_gs_ids;
  if (pGVar3 != (GLuint *)0x0) {
    if (this->m_number_of_gs != 0) {
      uVar4 = 0;
      do {
        (**(code **)(lVar2 + 0x470))(pGVar3[uVar4]);
        pGVar3 = this->m_gs_ids;
        pGVar3[uVar4] = 0;
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->m_number_of_gs);
    }
    operator_delete__(pGVar3);
    this->m_gs_ids = (GLuint *)0x0;
  }
  pGVar3 = this->m_po_ids;
  if (pGVar3 != (GLuint *)0x0) {
    if (this->m_number_of_gs != 0) {
      uVar4 = 0;
      do {
        (**(code **)(lVar2 + 0x448))(pGVar3[uVar4]);
        pGVar3 = this->m_po_ids;
        pGVar3[uVar4] = 0;
        uVar4 = uVar4 + 1;
      } while (uVar4 < this->m_number_of_gs);
    }
    operator_delete__(pGVar3);
    this->m_po_ids = (GLuint *)0x0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_vs_id = 0;
  }
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void GeometryShaderIncompatibleDrawCallModeTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);
		m_fs_id = 0;
	}

	if (m_gs_ids != 0)
	{
		for (glw::GLuint i = 0; i < m_number_of_gs; ++i)
		{
			gl.deleteShader(m_gs_ids[i]);
			m_gs_ids[i] = 0;
		}

		delete[] m_gs_ids;
		m_gs_ids = NULL;
	}

	if (m_po_ids != 0)
	{
		for (glw::GLuint i = 0; i < m_number_of_gs; ++i)
		{
			gl.deleteProgram(m_po_ids[i]);
			m_po_ids[i] = 0;
		}

		delete[] m_po_ids;
		m_po_ids = NULL;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
		m_vao_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);
		m_vs_id = 0;
	}

	/* Release base class */
	TestCaseBase::deinit();
}